

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void utf8_suite::test_F8_80_80_80_80(void)

{
  char input [8];
  decoder_type decoder;
  undefined4 local_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  value_type local_158 [8];
  basic_decoder<char> local_150;
  
  local_158[0] = '\"';
  local_158[1] = -8;
  local_158[2] = -0x80;
  local_158[3] = -0x80;
  local_158[4] = -0x80;
  local_158[5] = -0x80;
  local_158[6] = '\"';
  local_158[7] = '\0';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<8ul>(&local_150,&local_158);
  local_178._M_dataplus._M_p._0_4_ = local_150.current.code;
  local_17c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x858,"void utf8_suite::test_F8_80_80_80_80()",&local_178,&local_17c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_178,&local_150);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("decoder.string_value<std::string>()","\"\\xF8\\x80\\x80\\x80\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x859,"void utf8_suite::test_F8_80_80_80_80()",&local_178,anon_var_dwarf_6c30);
  std::__cxx11::string::~string((string *)&local_178);
  return;
}

Assistant:

void test_F8_80_80_80_80()
{
    const char input[] = "\"\xF8\x80\x80\x80\x80\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\xF8\x80\x80\x80\x80");
}